

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_rewrite_module.c
# Opt level: O0

char * ngx_http_rewrite_if(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  undefined8 *puVar1;
  size_t *psVar2;
  ngx_http_core_loc_conf_t *clcf_00;
  undefined8 *puVar3;
  void *pvVar4;
  long lVar5;
  ngx_int_t nVar6;
  char *pcVar7;
  ngx_http_rewrite_loc_conf_t *nlcf;
  ngx_http_script_if_code_t *if_code;
  ngx_http_core_loc_conf_t *pclcf;
  ngx_http_core_loc_conf_t *clcf;
  ngx_http_conf_ctx_t *pctx;
  ngx_http_conf_ctx_t *ctx;
  ngx_http_module_t *module;
  ngx_conf_t save;
  ngx_uint_t i;
  u_char *elts;
  char *rv;
  void *mconf;
  ngx_http_rewrite_loc_conf_t *lcf;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  puVar3 = (undefined8 *)ngx_pcalloc(cf->pool,0x18);
  if (puVar3 == (undefined8 *)0x0) {
    cf_local = (ngx_conf_t *)0xffffffffffffffff;
  }
  else {
    puVar1 = (undefined8 *)cf->ctx;
    *puVar3 = *puVar1;
    puVar3[1] = puVar1[1];
    pvVar4 = ngx_pcalloc(cf->pool,ngx_http_max_module << 3);
    puVar3[2] = pvVar4;
    if (puVar3[2] == 0) {
      cf_local = (ngx_conf_t *)0xffffffffffffffff;
    }
    else {
      for (save.handler_conf = (char *)0x0;
          cf->cycle->modules[(long)save.handler_conf] != (ngx_module_t *)0x0;
          save.handler_conf = save.handler_conf + 1) {
        if ((cf->cycle->modules[(long)save.handler_conf]->type == 0x50545448) &&
           (pvVar4 = cf->cycle->modules[(long)save.handler_conf]->ctx,
           *(long *)((long)pvVar4 + 0x30) != 0)) {
          lVar5 = (**(code **)((long)pvVar4 + 0x30))(cf);
          if (lVar5 == 0) {
            return (char *)0xffffffffffffffff;
          }
          *(long *)(puVar3[2] + cf->cycle->modules[(long)save.handler_conf]->ctx_index * 8) = lVar5;
        }
      }
      psVar2 = *(size_t **)(puVar1[2] + ngx_http_core_module.ctx_index * 8);
      clcf_00 = *(ngx_http_core_loc_conf_t **)(puVar3[2] + ngx_http_core_module.ctx_index * 8);
      clcf_00->loc_conf = (void **)puVar3[2];
      (clcf_00->name).len = *psVar2;
      (clcf_00->name).data = (u_char *)psVar2[1];
      *(ushort *)&clcf_00->field_0x18 = *(ushort *)&clcf_00->field_0x18 & 0xfffe | 1;
      nVar6 = ngx_http_add_location(cf,(ngx_queue_t **)(psVar2 + 0x53),clcf_00);
      if (nVar6 == 0) {
        pcVar7 = ngx_http_rewrite_if_condition(cf,(ngx_http_rewrite_loc_conf_t *)conf);
        if (pcVar7 == (char *)0x0) {
          nlcf = (ngx_http_rewrite_loc_conf_t *)ngx_array_push_n(*conf,0x18);
          if (nlcf == (ngx_http_rewrite_loc_conf_t *)0x0) {
            cf_local = (ngx_conf_t *)0xffffffffffffffff;
          }
          else {
            nlcf->codes = (ngx_array_t *)ngx_http_script_if_code;
            lVar5 = **conf;
            puVar1 = *(undefined8 **)(puVar3[2] + ngx_http_rewrite_module.ctx_index * 8);
            *puVar1 = *conf;
            memcpy(&module,cf,0x60);
            cf->ctx = puVar3;
            if (cf->cmd_type == 0x4000000) {
              nlcf->log = 0;
              cf->cmd_type = 0x20000000;
            }
            else {
              nlcf->log = puVar3[2];
              cf->cmd_type = 0x40000000;
            }
            cf_local = (ngx_conf_t *)ngx_conf_parse(cf,(ngx_str_t *)0x0);
            memcpy(cf,&module,0x60);
            if (cf_local == (ngx_conf_t *)0x0) {
              if (lVar5 != **conf) {
                nlcf = (ngx_http_rewrite_loc_conf_t *)((long)nlcf + (**conf - lVar5));
              }
              nlcf->stack_size = (**conf + *(long *)(*conf + 8)) - (long)nlcf;
              *puVar1 = 0;
              cf_local = (ngx_conf_t *)0x0;
            }
          }
        }
        else {
          cf_local = (ngx_conf_t *)0xffffffffffffffff;
        }
      }
      else {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
    }
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_rewrite_if(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_rewrite_loc_conf_t  *lcf = conf;

    void                         *mconf;
    char                         *rv;
    u_char                       *elts;
    ngx_uint_t                    i;
    ngx_conf_t                    save;
    ngx_http_module_t            *module;
    ngx_http_conf_ctx_t          *ctx, *pctx;
    ngx_http_core_loc_conf_t     *clcf, *pclcf;
    ngx_http_script_if_code_t    *if_code;
    ngx_http_rewrite_loc_conf_t  *nlcf;

    ctx = ngx_pcalloc(cf->pool, sizeof(ngx_http_conf_ctx_t));
    if (ctx == NULL) {
        return NGX_CONF_ERROR;
    }

    pctx = cf->ctx;
    ctx->main_conf = pctx->main_conf;
    ctx->srv_conf = pctx->srv_conf;

    ctx->loc_conf = ngx_pcalloc(cf->pool, sizeof(void *) * ngx_http_max_module);
    if (ctx->loc_conf == NULL) {
        return NGX_CONF_ERROR;
    }

    for (i = 0; cf->cycle->modules[i]; i++) {
        if (cf->cycle->modules[i]->type != NGX_HTTP_MODULE) {
            continue;
        }

        module = cf->cycle->modules[i]->ctx;

        if (module->create_loc_conf) {

            mconf = module->create_loc_conf(cf);
            if (mconf == NULL) {
                return NGX_CONF_ERROR;
            }

            ctx->loc_conf[cf->cycle->modules[i]->ctx_index] = mconf;
        }
    }

    pclcf = pctx->loc_conf[ngx_http_core_module.ctx_index];

    clcf = ctx->loc_conf[ngx_http_core_module.ctx_index];
    clcf->loc_conf = ctx->loc_conf;
    clcf->name = pclcf->name;
    clcf->noname = 1;

    if (ngx_http_add_location(cf, &pclcf->locations, clcf) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    if (ngx_http_rewrite_if_condition(cf, lcf) != NGX_CONF_OK) {
        return NGX_CONF_ERROR;
    }

    if_code = ngx_array_push_n(lcf->codes, sizeof(ngx_http_script_if_code_t));
    if (if_code == NULL) {
        return NGX_CONF_ERROR;
    }

    if_code->code = ngx_http_script_if_code;

    elts = lcf->codes->elts;


    /* the inner directives must be compiled to the same code array */

    nlcf = ctx->loc_conf[ngx_http_rewrite_module.ctx_index];
    nlcf->codes = lcf->codes;


    save = *cf;
    cf->ctx = ctx;

    if (cf->cmd_type == NGX_HTTP_SRV_CONF) {
        if_code->loc_conf = NULL;
        cf->cmd_type = NGX_HTTP_SIF_CONF;

    } else {
        if_code->loc_conf = ctx->loc_conf;
        cf->cmd_type = NGX_HTTP_LIF_CONF;
    }

    rv = ngx_conf_parse(cf, NULL);

    *cf = save;

    if (rv != NGX_CONF_OK) {
        return rv;
    }


    if (elts != lcf->codes->elts) {
        if_code = (ngx_http_script_if_code_t *)
                   ((u_char *) if_code + ((u_char *) lcf->codes->elts - elts));
    }

    if_code->next = (u_char *) lcf->codes->elts + lcf->codes->nelts
                                                - (u_char *) if_code;

    /* the code array belong to parent block */

    nlcf->codes = NULL;

    return NGX_CONF_OK;
}